

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  DescriptorBuilder *this_00;
  bool bVar1;
  Message *pMVar2;
  scoped_ptr<google::protobuf::UnknownFieldSet> p;
  const_iterator cVar3;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar8;
  UninterpretedOption *pUVar9;
  long *plVar10;
  long *plVar11;
  undefined8 *puVar12;
  undefined4 extraout_var_01;
  UnknownFieldSet *pUVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string *psVar15;
  undefined4 extraout_var_02;
  size_type *psVar16;
  _func_int **pp_Var17;
  long lVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  FieldDescriptor **ppFVar21;
  long lVar22;
  Symbol SVar23;
  FieldDescriptor *field;
  CodedOutputStream out;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  string debug_msg_name;
  StringOutputStream outstr;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  size_type __dnew_1;
  size_type __dnew;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_1f0;
  undefined1 local_1e8 [56];
  anon_union_8_7_bfa3a334_for_Symbol_2 local_1b0;
  LogFinisher local_1a1;
  undefined1 local_1a0 [56];
  Message *local_168;
  scoped_ptr<google::protobuf::UnknownFieldSet> local_160;
  const_iterator local_158;
  iterator iStack_150;
  FieldDescriptor **local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  StringOutputStream local_118;
  _func_int *local_108;
  long lStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [56];
  char *local_a0 [7];
  char *local_68 [7];
  undefined4 extraout_var_00;
  
  pUVar9 = this->uninterpreted_option_;
  iVar6 = (pUVar9->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 == 0) {
    local_d8._0_8_ = local_d8 + 0x10;
    local_68[0] = (char *)0x18;
    local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_68);
    local_d8._16_8_ = local_68[0];
    builtin_strncpy((char *)local_d8._0_8_,"Option must have a name.",0x18);
    local_d8._8_8_ = local_68[0];
    *(char *)(local_d8._0_8_ + (long)local_68[0]) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_d8);
  }
  else {
    if (iVar6 < 1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x338);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)local_68,"CHECK failed: (index) < (size()): ");
      internal::LogFinisher::operator=((LogFinisher *)local_d8,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    iVar6 = std::__cxx11::string::compare
                      (*(char **)((long)*(pUVar9->name_).super_RepeatedPtrFieldBase.elements_ + 0x10
                                 ));
    if (iVar6 != 0) {
      this_00 = this->builder_;
      iVar6 = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
      SVar23 = FindSymbolNotEnforcingDepsHelper
                         (this_00,this_00->pool_,*(string **)(CONCAT44(extraout_var,iVar6) + 8));
      if (SVar23.type != MESSAGE) {
        aVar8._0_4_ = (*(options->super_MessageLite)._vptr_MessageLite[0x13])(options);
        aVar8._4_4_ = extraout_var_00;
        SVar23.field_1.descriptor = aVar8.descriptor;
        SVar23._0_8_ = aVar8;
      }
      local_1f0 = SVar23.field_1;
      if ((DescriptorBuilder *)local_1f0.descriptor == (DescriptorBuilder *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                   ,0x10f9);
        pLVar7 = internal::LogMessage::operator<<
                           ((LogMessage *)local_a0,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)local_d8,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      local_1b0.descriptor = (Descriptor *)0x0;
      local_148 = (FieldDescriptor **)0x0;
      local_158._M_current = (FieldDescriptor **)0x0;
      iStack_150._M_current = (FieldDescriptor **)0x0;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      pUVar9 = this->uninterpreted_option_;
      iVar6 = (pUVar9->name_).super_RepeatedPtrFieldBase.current_size_;
      bVar5 = 0 < iVar6;
      local_168 = options;
      if (0 < iVar6) {
        bVar5 = true;
        lVar22 = 0;
        do {
          psVar15 = *(string **)
                     ((long)(pUVar9->name_).super_RepeatedPtrFieldBase.elements_[lVar22] + 0x10);
          if (local_138._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_138);
          }
          pUVar9 = this->uninterpreted_option_;
          if ((pUVar9->name_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)local_d8,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)local_1e8,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)local_d8);
          }
          if (*(char *)((long)(pUVar9->name_).super_RepeatedPtrFieldBase.elements_[lVar22] + 0x18)
              == '\x01') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,"(",psVar15);
            plVar10 = (long *)std::__cxx11::string::append((char *)local_1a0);
            local_1e8._0_8_ = local_1e8 + 0x10;
            psVar16 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar16) {
              local_1e8._16_8_ = *psVar16;
              local_1e8._24_8_ = plVar10[3];
            }
            else {
              local_1e8._16_8_ = *psVar16;
              local_1e8._0_8_ = (size_type *)*plVar10;
            }
            local_1e8._8_8_ = plVar10[1];
            *plVar10 = (long)psVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_138,local_1e8._0_8_);
            if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1a0 + 0x10)) {
              operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
            }
            aVar8 = (anon_union_8_7_bfa3a334_for_Symbol_2)this->builder_;
            SVar23 = LookupSymbol((DescriptorBuilder *)aVar8.descriptor,psVar15,
                                  &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,
                                  LOOKUP_ALL);
            if (SVar23.type == FIELD) {
              local_1b0 = SVar23.field_1;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)(psVar15->_M_dataplus)._M_p);
            aVar8 = local_1f0;
            local_1b0.field_descriptor = Descriptor::FindFieldByName(local_1f0.descriptor,psVar15);
          }
          plVar10 = (long *)(local_1e8 + 0x10);
          if (local_1b0.descriptor == (Descriptor *)0x0) {
            if (this->builder_->pool_->allow_unknown_ == false) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0,"Option \"",&local_138);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1a0);
              psVar16 = puVar12 + 2;
              if ((size_type *)*puVar12 == psVar16) {
                local_1e8._16_8_ = *psVar16;
                local_1e8._24_8_ = puVar12[3];
                local_1e8._0_8_ = plVar10;
              }
              else {
                local_1e8._16_8_ = *psVar16;
                local_1e8._0_8_ = (size_type *)*puVar12;
              }
              local_1e8._8_8_ = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1e8);
LAB_001dbfab:
              if ((long *)local_1e8._0_8_ != plVar10) {
LAB_001dbfb5:
                operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
              }
LAB_001dbfc2:
              uVar19 = local_1a0._16_8_;
              _Var20._M_p = (pointer)local_1a0._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1a0 + 0x10)) {
LAB_001dbfd1:
                operator_delete(_Var20._M_p,
                                (ulong)((long)&(((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                                  *)uVar19)->
                                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
              }
              goto LAB_001dbfd9;
            }
LAB_001dbcb2:
            AddWithoutInterpreting
                      ((OptionInterpreter *)aVar8.descriptor,this->uninterpreted_option_,local_168);
            options = (Message *)0x1;
            bVar1 = false;
          }
          else if (*(DescriptorBuilder **)(local_1b0.descriptor + 0x38) ==
                   (DescriptorBuilder *)local_1f0.descriptor) {
            if (*(int *)(local_1b0.descriptor + 0x30) == 3) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0,"Option field \"",&local_138);
              plVar11 = (long *)std::__cxx11::string::append((char *)local_1a0);
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                local_1e8._16_8_ = *psVar16;
                local_1e8._24_8_ = plVar11[3];
                local_1e8._0_8_ = plVar10;
              }
              else {
                local_1e8._16_8_ = *psVar16;
                local_1e8._0_8_ = (size_type *)*plVar11;
              }
              local_1e8._8_8_ = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1e8);
              goto LAB_001dbfab;
            }
            bVar1 = true;
            if (lVar22 < (long)(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.
                               current_size_ + -1) {
              if ((*(uint *)(local_1b0.descriptor + 0x2c) & 0xfffffffe) != 10) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a0,"Option \"",&local_138);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_1a0);
                psVar16 = puVar12 + 2;
                if ((size_type *)*puVar12 == psVar16) {
                  local_1e8._16_8_ = *psVar16;
                  local_1e8._24_8_ = puVar12[3];
                  local_1e8._0_8_ = local_1e8 + 0x10;
                }
                else {
                  local_1e8._16_8_ = *psVar16;
                  local_1e8._0_8_ = (size_type *)*puVar12;
                }
                local_1e8._8_8_ = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1e8
                        );
                if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) goto LAB_001dbfb5;
                goto LAB_001dbfc2;
              }
              if (iStack_150._M_current == local_148) {
                std::
                vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                          ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                            *)&local_158,iStack_150,&local_1b0.field_descriptor);
              }
              else {
                *iStack_150._M_current = (FieldDescriptor *)local_1b0;
                iStack_150._M_current = iStack_150._M_current + 1;
              }
              local_1f0 = (anon_union_8_7_bfa3a334_for_Symbol_2)
                          ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(local_1b0.descriptor + 0x48))->
                          descriptor;
            }
          }
          else {
            if (*(char *)&((*(DescriptorBuilder **)(local_1b0.descriptor + 0x38))->
                          options_to_interpret_).
                          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01')
            goto LAB_001dbcb2;
            std::operator+(&local_f8,"Option field \"",&local_138);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
            pp_Var17 = (_func_int **)(plVar11 + 2);
            if ((_func_int **)*plVar11 == pp_Var17) {
              local_108 = *pp_Var17;
              lStack_100 = plVar11[3];
              local_118.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_108;
            }
            else {
              local_108 = *pp_Var17;
              local_118.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream =
                   (_func_int **)*plVar11;
            }
            local_118.target_ = (string *)plVar11[1];
            *plVar11 = (long)pp_Var17;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_118,**(ulong **)local_1f0.descriptor);
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar14) {
              local_1a0._16_8_ = paVar14->_M_allocated_capacity;
              local_1a0._24_8_ = plVar11[3];
              local_1a0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_1a0 + 0x10);
            }
            else {
              local_1a0._16_8_ = paVar14->_M_allocated_capacity;
              local_1a0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar11;
            }
            local_1a0._8_8_ = plVar11[1];
            *plVar11 = (long)paVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a0);
            psVar16 = puVar12 + 2;
            if ((size_type *)*puVar12 == psVar16) {
              local_1e8._16_8_ = *psVar16;
              local_1e8._24_8_ = puVar12[3];
              local_1e8._0_8_ = plVar10;
            }
            else {
              local_1e8._16_8_ = *psVar16;
              local_1e8._0_8_ = (size_type *)*puVar12;
            }
            local_1e8._8_8_ = puVar12[1];
            *puVar12 = psVar16;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_1e8);
            if ((long *)local_1e8._0_8_ != plVar10) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1a0 + 0x10)) {
              operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
            }
            if (local_118.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_108) {
              operator_delete(local_118.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                              (ulong)(local_108 + 1));
            }
            uVar19 = local_f8.field_2._M_allocated_capacity;
            _Var20._M_p = local_f8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_001dbfd1;
LAB_001dbfd9:
            bVar1 = false;
            options = (Message *)0x0;
          }
          if (!bVar1) break;
          lVar22 = lVar22 + 1;
          pUVar9 = this->uninterpreted_option_;
          lVar18 = (long)(pUVar9->name_).super_RepeatedPtrFieldBase.current_size_;
          bVar5 = lVar22 < lVar18;
        } while (lVar22 < lVar18);
      }
      iVar4._M_current = iStack_150._M_current;
      cVar3._M_current = local_158._M_current;
      aVar8 = local_1b0;
      local_1f0._0_1_ = SUB81(options,0);
      if (!bVar5) {
        local_1f0 = (anon_union_8_7_bfa3a334_for_Symbol_2)((ulong)options & 0xffffffff);
        iVar6 = (*(local_168->super_MessageLite)._vptr_MessageLite[0x12])();
        pUVar13 = (UnknownFieldSet *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x10))
                            ((long *)CONCAT44(extraout_var_01,iVar6),local_168);
        bVar5 = ExamineIfOptionIsSet
                          (this,cVar3,(const_iterator)iVar4._M_current,aVar8.field_descriptor,
                           &local_138,pUVar13);
        if (bVar5) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(8);
          UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)&paVar14->_M_allocated_capacity);
          local_f8._M_dataplus._M_p = (pointer)paVar14;
          bVar5 = SetOptionValue(this,local_1b0.field_descriptor,
                                 (UnknownFieldSet *)&paVar14->_M_allocated_capacity);
          iVar4._M_current = iStack_150._M_current;
          if (bVar5) {
            do {
              ppFVar21 = iVar4._M_current;
              cVar3._M_current = local_158._M_current;
              if (ppFVar21 == local_158._M_current) break;
              pUVar13 = (UnknownFieldSet *)operator_new(8);
              UnknownFieldSet::UnknownFieldSet(pUVar13);
              iVar4._M_current = ppFVar21 + -1;
              iVar6 = *(int *)(ppFVar21[-1] + 0x2c);
              local_160.ptr_ = pUVar13;
              if (iVar6 == 10) {
                pUVar13 = UnknownFieldSet::AddGroup(pUVar13,*(int *)(ppFVar21[-1] + 0x28));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_001dc41d;
                UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_f8._M_dataplus._M_p);
LAB_001dc2cc:
                p.ptr_ = local_160.ptr_;
                local_160.ptr_ = (UnknownFieldSet *)0x0;
                internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
                          ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_f8,p.ptr_);
                bVar5 = true;
              }
              else {
                if (iVar6 == 0xb) {
                  psVar15 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                                      (pUVar13,*(int *)(*iVar4._M_current + 0x28));
                  io::StringOutputStream::StringOutputStream(&local_118,psVar15);
                  io::CodedOutputStream::CodedOutputStream
                            ((CodedOutputStream *)local_1a0,&local_118.super_ZeroCopyOutputStream);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    internal::WireFormat::SerializeUnknownFields
                              ((UnknownFieldSet *)local_f8._M_dataplus._M_p,
                               (CodedOutputStream *)local_1a0);
                    if (local_1a0[0x18] == '\x01') {
                      internal::LogMessage::LogMessage
                                ((LogMessage *)local_1e8,LOGLEVEL_DFATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                                 ,0x116f);
                      pLVar7 = internal::LogMessage::operator<<
                                         ((LogMessage *)local_1e8,"CHECK failed: !out.HadError(): ")
                      ;
                      pLVar7 = internal::LogMessage::operator<<
                                         (pLVar7,
                                          "Unexpected failure while serializing option submessage ")
                      ;
                      pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_138);
                      pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
                      internal::LogFinisher::operator=(&local_1a1,pLVar7);
                      internal::LogMessage::~LogMessage((LogMessage *)local_1e8);
                    }
                    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_1a0);
                    io::StringOutputStream::~StringOutputStream(&local_118);
                    goto LAB_001dc2cc;
                  }
                  goto LAB_001dc41d;
                }
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_1a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                           ,0x117c);
                pLVar7 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_1a0,
                                    "Invalid wire type for CPPTYPE_MESSAGE: ");
                pLVar7 = internal::LogMessage::operator<<(pLVar7,*(int *)(*iVar4._M_current + 0x2c))
                ;
                internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar7);
                internal::LogMessage::~LogMessage((LogMessage *)local_1a0);
                bVar5 = false;
                local_1f0 = (anon_union_8_7_bfa3a334_for_Symbol_2)0x0;
              }
              internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_160);
            } while (bVar5);
            pMVar2 = local_168;
            if (ppFVar21 == cVar3._M_current) {
              iVar6 = (*(local_168->super_MessageLite)._vptr_MessageLite[0x12])(local_168);
              pUVar13 = (UnknownFieldSet *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x18))
                                  ((long *)CONCAT44(extraout_var_02,iVar6),pMVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
LAB_001dc41d:
                __assert_fail("ptr_ != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                              ,0x1de,
                              "C &google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*() const [C = google::protobuf::UnknownFieldSet]"
                             );
              }
              local_1f0._0_1_ = 1;
              UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_f8._M_dataplus._M_p);
            }
          }
          else {
            local_1f0._0_1_ = 0;
          }
          internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
                    ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_f8);
        }
        else {
          local_1f0._0_1_ = 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      if (local_158._M_current != (FieldDescriptor **)0x0) {
        operator_delete(local_158._M_current,(long)local_148 - (long)local_158._M_current);
      }
      goto LAB_001dc404;
    }
    local_d8._0_8_ = local_d8 + 0x10;
    local_a0[0] = (char *)0x39;
    local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)local_a0);
    local_d8._16_8_ = local_a0[0];
    builtin_strncpy((char *)local_d8._0_8_,
                    "Option must not use reserved name \"uninterpreted_option\".",0x39);
    local_d8._8_8_ = local_a0[0];
    *(char *)(local_d8._0_8_ + (long)local_a0[0]) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_d8);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
  }
  local_1f0._0_1_ = 0;
LAB_001dc404:
  return (bool)(local_1f0._0_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (field->is_repeated()) {
      return AddNameError("Option field \"" + debug_msg_name +
                          "\" is repeated. Repeated options are not "
                          "supported.");
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    scoped_ptr<UnknownFieldSet> parent_unknown_fields(new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}